

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::NetPrivate::convert_layout(NetPrivate *this,Mat *bottom_blob,Layer *layer,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  Mat local_78;
  
  if ((opt->use_bf16_storage == true) && (iVar4 = bottom_blob->elempack, iVar4 != 0)) {
    if ((((int)bottom_blob->elemsize << 3) / iVar4 == 0x20) && (layer->support_bf16_storage == true)
       ) {
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      cast_float32_to_bfloat16(bottom_blob,&local_78,opt);
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (&local_78 != bottom_blob) {
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (bottom_blob->allocator == (Allocator *)0x0) {
              free(bottom_blob->data);
            }
            else {
              (*bottom_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        bottom_blob->data = local_78.data;
        piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        bottom_blob->refcount = piVar6;
        bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        bottom_blob->elempack = local_78.elempack;
        bottom_blob->allocator = local_78.allocator;
        bottom_blob->dims = local_78.dims;
        bottom_blob->w = local_78.w;
        bottom_blob->h = local_78.h;
        bottom_blob->d = local_78.d;
        bottom_blob->c = local_78.c;
        bottom_blob->cstep = local_78.cstep;
      }
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar4 = bottom_blob->elempack;
      if (iVar4 == 0) goto LAB_00169393;
    }
    if ((((int)bottom_blob->elemsize << 3) / iVar4 == 0x10) &&
       (layer->support_bf16_storage == false)) {
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      cast_bfloat16_to_float32(bottom_blob,&local_78,opt);
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (&local_78 != bottom_blob) {
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = bottom_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (bottom_blob->allocator == (Allocator *)0x0) {
              free(bottom_blob->data);
            }
            else {
              (*bottom_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        bottom_blob->data = local_78.data;
        piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        bottom_blob->refcount = piVar6;
        bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        bottom_blob->elempack = local_78.elempack;
        bottom_blob->allocator = local_78.allocator;
        bottom_blob->dims = local_78.dims;
        bottom_blob->w = local_78.w;
        bottom_blob->h = local_78.h;
        bottom_blob->d = local_78.d;
        bottom_blob->c = local_78.c;
        bottom_blob->cstep = local_78.cstep;
      }
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
LAB_00169393:
  iVar4 = 1;
  if (opt->use_packing_layout == true) {
    iVar5 = bottom_blob->elempack;
    iVar1 = bottom_blob->dims;
    iVar3 = 0;
    uVar7 = bottom_blob->w * iVar5;
    if (iVar1 != 1) {
      uVar7 = 0;
    }
    uVar2 = bottom_blob->h * iVar5;
    if (iVar1 != 2) {
      uVar2 = uVar7;
    }
    uVar7 = bottom_blob->c * iVar5;
    if (1 < iVar1 - 3U) {
      uVar7 = uVar2;
    }
    if (iVar5 == 0) {
      iVar4 = 1;
      if (layer->support_packing == false) goto LAB_0016944b;
    }
    else {
      if (layer->support_packing == false) goto LAB_0016944b;
      iVar3 = ((int)bottom_blob->elemsize << 3) / iVar5;
      if (iVar3 == 0x20) {
        iVar3 = 0x20;
        if (((uVar7 & 0xf) == 0) && (iVar4 = cpu_support_x86_avx512(), iVar4 != 0)) {
          iVar4 = 0x10;
        }
        else if (((uVar7 & 7) != 0) || (iVar5 = cpu_support_x86_avx(), iVar4 = 8, iVar5 == 0)) {
          iVar4 = (uint)((uVar7 & 3) == 0) * 3 + 1;
        }
      }
      else {
        iVar4 = 1;
      }
    }
    iVar5 = 4;
    if ((uVar7 & 3) != 0 || iVar3 != 0x10) {
      iVar5 = iVar4;
    }
    iVar4 = iVar5;
    if ((uVar7 & 7) == 0 && iVar3 == 8) {
      iVar4 = 8;
    }
  }
LAB_0016944b:
  if (bottom_blob->elempack != iVar4) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    convert_packing(bottom_blob,&local_78,iVar4,opt);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&local_78 != bottom_blob) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = bottom_blob->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (bottom_blob->allocator == (Allocator *)0x0) {
            free(bottom_blob->data);
          }
          else {
            (*bottom_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      bottom_blob->data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      bottom_blob->refcount = piVar6;
      bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      bottom_blob->elempack = local_78.elempack;
      bottom_blob->allocator = local_78.allocator;
      bottom_blob->dims = local_78.dims;
      bottom_blob->w = local_78.w;
      bottom_blob->h = local_78.h;
      bottom_blob->d = local_78.d;
      bottom_blob->c = local_78.c;
      bottom_blob->cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int NetPrivate::convert_layout(Mat& bottom_blob, const Layer* layer, const Option& opt) const
{
    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (opt.use_fp16_storage && cpu_support_arm_asimdhp())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_RVV
    if (opt.use_fp16_storage && cpu_support_riscv_v() && cpu_support_riscv_zfh())
    {
        if (bottom_blob.elembits() == 32 && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_RVV
#if NCNN_BF16
    if (opt.use_bf16_storage)
    {
        if (bottom_blob.elembits() == 32 && layer->support_bf16_storage)
        {
            Mat bottom_blob_bf16;
            cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
            bottom_blob = bottom_blob_bf16;
        }
        if (bottom_blob.elembits() == 16 && !layer->support_bf16_storage)
        {
            Mat bottom_blob_fp32;
            cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
    }
    else
#endif // NCNN_BF16
    {
        // no type conversion
    }
    // *INDENT-ON*
    // clang-format on

    int dst_elempack = 1;
    if (opt.use_packing_layout)
    {
        // resolve dst_elempack
        int dims = bottom_blob.dims;
        int elemcount = 0;
        if (dims == 1) elemcount = bottom_blob.elempack * bottom_blob.w;
        if (dims == 2) elemcount = bottom_blob.elempack * bottom_blob.h;
        if (dims == 3 || dims == 4) elemcount = bottom_blob.elempack * bottom_blob.c;

        int elembits = bottom_blob.elembits();

        if (layer->support_packing)
        {
            if (elembits == 32)
            {
#if NCNN_AVX512
                if (elemcount % 16 == 0 && ncnn::cpu_support_x86_avx512())
                    dst_elempack = 16;
                else if (elemcount % 8 == 0 && ncnn::cpu_support_x86_avx())
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_AVX
                if (elemcount % 8 == 0 && ncnn::cpu_support_x86_avx())
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 4;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 16)
            {
#if NCNN_ARM82
                if (elemcount % 8 == 0 && ncnn::cpu_support_arm_asimdhp() && opt.use_fp16_arithmetic)
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 2;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 8)
            {
#if NCNN_RVV
                const int packn = ncnn::cpu_riscv_vlenb() / 1;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 8 == 0)
                    dst_elempack = 8;
#endif
            }
        }
    }

    if (bottom_blob.elempack != dst_elempack)
    {
        Mat bottom_blob_packed;
        convert_packing(bottom_blob, bottom_blob_packed, dst_elempack, opt);
        bottom_blob = bottom_blob_packed;
    }

    return 0;
}